

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::GetValuesOrEntries
              (RecyclableObject *object,bool valuesToReturn,ScriptContext *scriptContext)

{
  int propertyId;
  Type TVar1;
  code *pcVar2;
  ScriptContext *pSVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptArray *pJVar8;
  JavascriptArray *this;
  SparseArraySegmentBase *pSVar9;
  uint32 uVar10;
  undefined7 in_register_00000031;
  Type TVar11;
  undefined1 local_a8 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  JavascriptArray *local_58;
  Type local_50;
  undefined4 local_4c;
  RecyclableObject *local_48;
  undefined4 *local_40;
  ScriptContext *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,valuesToReturn);
  local_48 = object;
  local_38 = scriptContext;
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x45d,"(object != nullptr)","object != nullptr");
    if (!bVar4) goto LAB_00ce29d8;
    *puVar6 = 0;
  }
  if (local_38 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x45e,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar4) {
LAB_00ce29d8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pSVar3 = local_38;
  TVar11 = 0;
  local_58 = JavascriptLibrary::CreateArray((local_38->super_ScriptContextBase).javascriptLibrary,0)
  ;
  propertyDescriptor._40_8_ = JavascriptOperators::GetOwnPropertyNames(local_48,pSVar3);
  local_50 = (((JavascriptArray *)propertyDescriptor._40_8_)->super_ArrayObject).length;
  local_68 = (PropertyRecord *)0x0;
  if (local_50 != 0) {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    propertyRecord = (PropertyRecord *)0x0;
    do {
      puVar6 = local_40;
      pvVar7 = (Var)(**(code **)(*(long *)propertyDescriptor._40_8_ + 0x390))
                              (propertyDescriptor._40_8_,TVar11);
      bVar4 = VarIs<Js::JavascriptString>(pvVar7);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                    ,0x46a,"(VarIs<JavascriptString>(nextKey))",
                                    "VarIs<JavascriptString>(nextKey)");
        if (!bVar4) goto LAB_00ce29d8;
        *puVar6 = 0;
      }
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a8);
      JavascriptConversion::ToPropertyKey(pvVar7,local_38,&local_68,(PropertyString **)0x0);
      propertyId = local_68->pid;
      if (propertyId == -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = local_40;
        *local_40 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                    ,0x470,"(propertyId != Constants::NoProperty)",
                                    "propertyId != Constants::NoProperty");
        if (!bVar4) goto LAB_00ce29d8;
        *puVar6 = 0;
      }
      BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                        (local_48,propertyId,local_38,(PropertyDescriptor *)local_a8);
      if ((BVar5 != 0) &&
         (bVar4 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_a8), bVar4)) {
        pJVar8 = (JavascriptArray *)
                 JavascriptOperators::GetProperty
                           (local_48,propertyId,local_38,(PropertyValueInfo *)0x0);
        pSVar3 = local_38;
        if ((char)local_4c == '\0') {
          this = JavascriptLibrary::CreateArray
                           ((local_38->super_ScriptContextBase).javascriptLibrary,2);
          pvVar7 = CrossSite::MarshalVar(pSVar3,pvVar7,false);
          TVar1 = ((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
                  typeId;
          if ((TVar1 == TypeIds_Array) || (TVar1 == TypeIds_ArrayLastWithES5)) {
            pSVar9 = JavascriptArray::GetLastUsedSegment(this);
            if ((pSVar9->left == 0) && (pSVar9->size != 0)) {
              JavascriptArray::DirectSetItemInLastUsedSegmentAt<void*>(this,0,pvVar7);
            }
            else {
              JavascriptArray::DirectSetItem_Full<void*>(this,0,pvVar7);
            }
            pvVar7 = CrossSite::MarshalVar(local_38,pJVar8,false);
            TVar1 = ((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)
                    ->typeId;
            if ((TVar1 == TypeIds_Array) || (TVar1 == TypeIds_ArrayLastWithES5)) {
              pSVar9 = JavascriptArray::GetLastUsedSegment(this);
              uVar10 = 1 - pSVar9->left;
              pJVar8 = this;
              if ((pSVar9->left < 2) && (uVar10 < pSVar9->size)) {
                JavascriptArray::DirectSetItemInLastUsedSegmentAt<void*>(this,uVar10,pvVar7);
              }
              else {
                JavascriptArray::DirectSetItem_Full<void*>(this,1,pvVar7);
              }
              goto LAB_00ce2932;
            }
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_40 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                      ,0x1c4,
                                      "(this->GetTypeId() == TypeIds_Array || this->GetTypeId() == TypeIds_ES5Array)"
                                      ,
                                      "this->GetTypeId() == TypeIds_Array || this->GetTypeId() == TypeIds_ES5Array"
                                     );
          if (bVar4) {
            *local_40 = 0;
            Throw::FatalInternalError(-0x7fffbffb);
          }
          goto LAB_00ce29d8;
        }
LAB_00ce2932:
        uVar10 = (uint32)propertyRecord;
        pvVar7 = CrossSite::MarshalVar(local_38,pJVar8,false);
        JavascriptArray::DirectSetItemAt<void*>(local_58,uVar10,pvVar7);
        propertyRecord = (PropertyRecord *)(ulong)(uVar10 + 1);
      }
      TVar11 = TVar11 + 1;
    } while (local_50 != TVar11);
  }
  return local_58;
}

Assistant:

Var JavascriptObject::GetValuesOrEntries(RecyclableObject* object, bool valuesToReturn, ScriptContext* scriptContext)
{
    Assert(object != nullptr);
    Assert(scriptContext != nullptr);
    JavascriptArray* valuesArray = scriptContext->GetLibrary()->CreateArray(0);

    JavascriptArray* ownKeysResult = JavascriptOperators::GetOwnPropertyNames(object, scriptContext);
    uint32 length = ownKeysResult->GetLength();

    Var nextKey;
    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    for (uint32 i = 0, index = 0; i < length; i++)
    {
        nextKey = ownKeysResult->DirectGetItem(i);
        Assert(VarIs<JavascriptString>(nextKey));

        PropertyDescriptor propertyDescriptor;

        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        Assert(propertyId != Constants::NoProperty);

        if (JavascriptOperators::GetOwnPropertyDescriptor(object, propertyId, scriptContext, &propertyDescriptor))
        {
            if (propertyDescriptor.IsEnumerable())
            {
                Var value = JavascriptOperators::GetProperty(object, propertyId, scriptContext);

                if (!valuesToReturn)
                {
                    // For Object.entries each entry is key, value pair
                    JavascriptArray* entry = scriptContext->GetLibrary()->CreateArray(2);
                    entry->DirectSetItemAt(0, CrossSite::MarshalVar(scriptContext, nextKey));
                    entry->DirectSetItemAt(1, CrossSite::MarshalVar(scriptContext, value));
                    value = entry;
                }
                valuesArray->DirectSetItemAt(index++, CrossSite::MarshalVar(scriptContext, value));
            }
        }
    }

    return valuesArray;
}